

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

TablePartitionInfo __thiscall
duckdb::MultiFileReader::GetPartitionInfo
          (MultiFileReader *this,ClientContext *context,MultiFileReaderBindData *bind_data,
          TableFunctionPartitionInput *input)

{
  idx_t *piVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pHVar4;
  
  puVar2 = (input->partition_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (input->partition_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pHVar4 = (bind_data->hive_partitioning_indexes).
               super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
               .
               super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
               ._M_impl.super__Vector_impl_data._M_start, puVar3 != puVar2; puVar3 = puVar3 + 1) {
    do {
      if (pHVar4 == (bind_data->hive_partitioning_indexes).
                    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                    .
                    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_008cee1d;
      piVar1 = &pHVar4->index;
      pHVar4 = pHVar4 + 1;
    } while (*piVar1 != *puVar3);
  }
LAB_008cee1d:
  return puVar3 == puVar2;
}

Assistant:

TablePartitionInfo MultiFileReader::GetPartitionInfo(ClientContext &context, const MultiFileReaderBindData &bind_data,
                                                     TableFunctionPartitionInput &input) {
	// check if all of the columns are in the hive partition set
	for (auto &partition_col : input.partition_ids) {
		// check if this column is in the hive partitioned set
		bool found = false;
		for (auto &partition : bind_data.hive_partitioning_indexes) {
			if (partition.index == partition_col) {
				found = true;
				break;
			}
		}
		if (!found) {
			// the column is not partitioned - hive partitioning alone can't guarantee the groups are partitioned
			return TablePartitionInfo::NOT_PARTITIONED;
		}
	}
	// if all columns are in the hive partitioning set, we know that each partition will only have a single value
	// i.e. if the hive partitioning is by (YEAR, MONTH), each partition will have a single unique (YEAR, MONTH)
	return TablePartitionInfo::SINGLE_VALUE_PARTITIONS;
}